

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void * AllocUnitsRare(CPpmd7 *p,uint indx)

{
  byte bVar1;
  CPpmd_Void_Ref CVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar7;
  Byte *pBVar8;
  ulong uVar9;
  CPpmd_Void_Ref *pCVar10;
  uint uVar11;
  Byte *pBVar12;
  ulong uVar13;
  ulong uVar6;
  
  uVar3 = (ulong)indx;
  uVar6 = uVar3;
  if (p->GlueCount == 0) {
    uVar4 = p->Size + p->AlignOffset;
    p->GlueCount = 0xff;
    lVar7 = 0;
    uVar5 = uVar4;
    do {
      bVar1 = p->Indx2Units[lVar7];
      CVar2 = p->FreeList[lVar7];
      p->FreeList[lVar7] = 0;
      if (CVar2 != 0) {
        pBVar8 = p->Base;
        uVar11 = uVar5;
        do {
          uVar5 = CVar2;
          *(uint *)(pBVar8 + (ulong)uVar5 + 4) = uVar11;
          *(uint *)(pBVar8 + (ulong)uVar11 + 8) = uVar5;
          CVar2 = *(CPpmd_Void_Ref *)(pBVar8 + uVar5);
          (pBVar8 + uVar5)[0] = '\0';
          (pBVar8 + uVar5)[1] = '\0';
          *(ushort *)(pBVar8 + (ulong)uVar5 + 2) = (ushort)bVar1;
          uVar11 = uVar5;
        } while (CVar2 != 0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x26);
    pBVar8 = p->Base;
    (pBVar8 + uVar4)[0] = '\x01';
    (pBVar8 + uVar4)[1] = '\0';
    *(uint *)(pBVar8 + (ulong)uVar4 + 4) = uVar5;
    *(uint *)(pBVar8 + (ulong)uVar5 + 8) = uVar4;
    pBVar12 = p->LoUnit;
    if (pBVar12 != p->HiUnit) {
      pBVar12[0] = '\x01';
      pBVar12[1] = '\0';
    }
    while (uVar5 != uVar4) {
      uVar9 = (ulong)uVar5;
      uVar13 = (ulong)*(ushort *)(pBVar8 + uVar9 + 2);
      uVar5 = (uint)*(ushort *)(pBVar8 + uVar13 * 0xc + uVar9 + 2) +
              (uint)*(ushort *)(pBVar8 + uVar9 + 2);
      if (uVar5 < 0x10000 && *(short *)(pBVar8 + uVar13 * 0xc + uVar9) == 0) {
        pBVar12 = pBVar8 + uVar13 * 0xc + uVar9;
        do {
          uVar11 = *(uint *)(pBVar12 + 8);
          *(undefined4 *)(pBVar8 + (ulong)uVar11 + 4) = *(undefined4 *)(pBVar12 + 4);
          *(uint *)(pBVar8 + (ulong)*(uint *)(pBVar12 + 4) + 8) = uVar11;
          *(short *)(pBVar8 + uVar9 + 2) = (short)uVar5;
          if (*(short *)(pBVar8 + (ulong)uVar5 * 0xc + uVar9) != 0) break;
          pBVar12 = pBVar8 + (ulong)uVar5 * 0xc + uVar9;
          uVar5 = uVar5 + *(ushort *)(pBVar12 + 2);
        } while (uVar5 < 0x10000);
      }
      uVar5 = *(uint *)(pBVar8 + uVar9 + 4);
    }
    uVar5 = *(uint *)(pBVar8 + (ulong)uVar4 + 4);
    while (uVar5 != uVar4) {
      uVar9 = (ulong)uVar5;
      uVar5 = *(uint *)(pBVar8 + uVar9 + 4);
      uVar11 = (uint)*(ushort *)(pBVar8 + uVar9 + 2);
      if (0x80 < *(ushort *)(pBVar8 + uVar9 + 2)) {
        do {
          *(CPpmd_Void_Ref *)(pBVar8 + uVar9) = p->FreeList[0x25];
          p->FreeList[0x25] = (CPpmd_Void_Ref)uVar9;
          uVar11 = uVar11 - 0x80;
          uVar9 = uVar9 + 0x600;
        } while (0x80 < uVar11);
      }
      pCVar10 = (CPpmd_Void_Ref *)(pBVar8 + uVar9);
      uVar9 = (ulong)p->Units2Indx[uVar11 - 1];
      if (uVar11 != p->Indx2Units[uVar9]) {
        uVar9 = (ulong)(p->Units2Indx[uVar11 - 1] - 1);
        bVar1 = p->Indx2Units[uVar9];
        uVar11 = uVar11 + ~(uint)bVar1;
        pCVar10[(ulong)bVar1 * 3] = p->FreeList[uVar11];
        p->FreeList[uVar11] = (int)(pCVar10 + (ulong)bVar1 * 3) - (int)pBVar8;
      }
      *pCVar10 = p->FreeList[uVar9];
      p->FreeList[uVar9] = (int)pCVar10 - (int)pBVar8;
    }
    uVar9 = (ulong)p->FreeList[uVar3];
    if (uVar9 != 0) {
      p->FreeList[uVar3] = *(CPpmd_Void_Ref *)(pBVar8 + uVar9);
      return pBVar8 + uVar9;
    }
  }
  do {
    if ((int)uVar6 == 0x25) {
      bVar1 = p->Indx2Units[uVar3];
      p->GlueCount = p->GlueCount - 1;
      if ((uint)bVar1 * 0xc < (uint)((int)p->UnitsStart - *(int *)&p->Text)) {
        pBVar8 = p->UnitsStart + (ulong)bVar1 * -0xc;
        p->UnitsStart = pBVar8;
        return pBVar8;
      }
      return (void *)0x0;
    }
    uVar5 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar5;
    uVar9 = (ulong)p->FreeList[uVar6];
  } while (uVar9 == 0);
  pBVar8 = p->Base + uVar9;
  p->FreeList[uVar6] = *(CPpmd_Void_Ref *)(p->Base + uVar9);
  SplitBlock(p,pBVar8,uVar5,indx);
  return pBVar8;
}

Assistant:

static void *AllocUnitsRare(CPpmd8 *p, unsigned indx)
{
  unsigned i;
  void *retVal;
  if (p->GlueCount == 0)
  {
    GlueFreeBlocks(p);
    if (p->FreeList[indx] != 0)
      return RemoveNode(p, indx);
  }
  i = indx;
  do
  {
    if (++i == PPMD_NUM_INDEXES)
    {
      UInt32 numBytes = U2B(I2U(indx));
      p->GlueCount--;
      return ((UInt32)(p->UnitsStart - p->Text) > numBytes) ? (p->UnitsStart -= numBytes) : (NULL);
    }
  }
  while (p->FreeList[i] == 0);
  retVal = RemoveNode(p, i);
  SplitBlock(p, retVal, i, indx);
  return retVal;
}